

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O1

void SourceMap::Add(AutoString *path,AutoString *data)

{
  FileNode *pFVar1;
  
  pFVar1 = (FileNode *)operator_new(0x48);
  (pFVar1->data).length = data->length;
  (pFVar1->data).data = data->data;
  (pFVar1->data).data_wide = data->data_wide;
  (pFVar1->data).errorCode = JsNoError;
  (pFVar1->data).dontFree = false;
  data->dontFree = true;
  (pFVar1->path).length = path->length;
  (pFVar1->path).data = path->data;
  (pFVar1->path).data_wide = path->data_wide;
  (pFVar1->path).errorCode = JsNoError;
  (pFVar1->path).dontFree = false;
  path->dontFree = true;
  pFVar1->next = (FileNode *)0x0;
  path->dontFree = true;
  data->dontFree = true;
  if (root != (FileNode *)0x0) {
    pFVar1->next = root;
  }
  root = pFVar1;
  return;
}

Assistant:

static void Add(AutoString &path, AutoString &data)
    {
        // SourceMap lifetime == process lifetime
        FileNode * node = new FileNode(path, data);
        if (root != nullptr)
        {
            node->next = root;
        }
        root = node;
    }